

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O0

void __thiscall senjo::UCIAdapter::OptsCommand(UCIAdapter *this,char *param_1)

{
  bool bVar1;
  OptionType OVar2;
  int iVar3;
  Output *pOVar4;
  undefined4 extraout_var;
  reference x;
  char local_159;
  _Self local_158;
  _Base_ptr local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [39];
  char local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  Output local_100;
  Output out;
  const_iterator it_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *values;
  char local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [39];
  char local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  Output local_78 [3];
  reference local_60;
  EngineOption *opt;
  _List_const_iterator<senjo::EngineOption> local_50;
  iterator local_48;
  _List_const_iterator<senjo::EngineOption> local_40;
  _List_const_iterator<senjo::EngineOption> local_38;
  const_iterator it;
  list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> opts;
  char *param_1_local;
  UCIAdapter *this_local;
  
  (*this->engine->_vptr_ChessEngine[5])(&it);
  std::_List_const_iterator<senjo::EngineOption>::_List_const_iterator(&local_38);
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_>::begin
                 ((list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> *)&it);
  std::_List_const_iterator<senjo::EngineOption>::_List_const_iterator(&local_40,&local_48);
  local_38._M_node = local_40._M_node;
  do {
    opt = (EngineOption *)
          std::__cxx11::list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_>::end
                    ((list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> *)&it);
    std::_List_const_iterator<senjo::EngineOption>::_List_const_iterator(&local_50,(iterator *)&opt)
    ;
    bVar1 = std::operator!=(&local_38,&local_50);
    if (!bVar1) {
      std::__cxx11::list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_>::~list
                ((list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> *)&it);
      return;
    }
    local_60 = std::_List_const_iterator<senjo::EngineOption>::operator*(&local_38);
    OVar2 = EngineOption::GetType(local_60);
    if (OVar2 == Checkbox) {
LAB_0014c3e0:
      Output::Output(local_78,InfoPrefix);
      (**local_60->_vptr_EngineOption)(local_98);
      pOVar4 = Output::operator<<(local_78,local_98);
      local_99 = ':';
      pOVar4 = Output::operator<<(pOVar4,&local_99);
      (*local_60->_vptr_EngineOption[1])(local_c0);
      pOVar4 = Output::operator<<(pOVar4,local_c0);
      local_c1 = ' ';
      pOVar4 = Output::operator<<(pOVar4,&local_c1);
      (*local_60->_vptr_EngineOption[2])(&values);
      Output::operator<<(pOVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&values);
      std::__cxx11::string::~string((string *)&values);
      std::__cxx11::string::~string((string *)local_c0);
      std::__cxx11::string::~string((string *)local_98);
      Output::~Output(local_78);
    }
    else if (OVar2 == ComboBox) {
      iVar3 = (*local_60->_vptr_EngineOption[8])();
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Rb_tree_const_iterator
                ((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&out);
      Output::Output(&local_100,InfoPrefix);
      (**local_60->_vptr_EngineOption)(local_120);
      pOVar4 = Output::operator<<(&local_100,local_120);
      local_121 = ':';
      pOVar4 = Output::operator<<(pOVar4,&local_121);
      (*local_60->_vptr_EngineOption[1])(local_148);
      Output::operator<<(pOVar4,local_148);
      std::__cxx11::string::~string((string *)local_148);
      std::__cxx11::string::~string((string *)local_120);
      local_150 = (_Base_ptr)
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT44(extraout_var,iVar3));
      out._vptr_Output = (_func_int **)local_150;
      while( true ) {
        local_158._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(extraout_var,iVar3));
        bVar1 = std::operator!=((_Self *)&out,&local_158);
        if (!bVar1) break;
        local_159 = ' ';
        pOVar4 = Output::operator<<(&local_100,&local_159);
        x = std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&out);
        Output::operator<<(pOVar4,x);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&out);
      }
      Output::~Output(&local_100);
    }
    else if (OVar2 - Spin < 2) goto LAB_0014c3e0;
    std::_List_const_iterator<senjo::EngineOption>::operator++(&local_38);
  } while( true );
}

Assistant:

void UCIAdapter::OptsCommand(const char* /*params*/)
{
  std::list<EngineOption> opts = engine->GetOptions();
  std::list<EngineOption>::const_iterator it;
  for (it = opts.begin(); it != opts.end(); ++it) {
    const EngineOption& opt = *it;
    switch (opt.GetType()) {
    case EngineOption::Checkbox:
    case EngineOption::Spin:
    case EngineOption::String:
      Output() << opt.GetTypeName() << ':' << opt.GetName() << ' '
               << opt.GetValue();
      break;
    case EngineOption::ComboBox: {
      const std::set<std::string>& values = opt.GetComboValues();
      std::set<std::string>::const_iterator it;
      Output out;
      out << opt.GetTypeName() << ':' << opt.GetName();
      for (it = values.begin(); it != values.end(); ++it) {
        out << ' ' << *it;
      }
    }
    default:
      break;
    }
  }
}